

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_islow(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int local_7c;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 z1;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  JDIMENSION start_col_local;
  JSAMPARRAY sample_data_local;
  DCTELEM *data_local;
  
  elemptr = (JSAMPROW)data;
  for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
    pbVar3 = sample_data[local_7c] + start_col;
    iVar1 = (uint)*pbVar3 + (uint)pbVar3[7] + (uint)pbVar3[3] + (uint)pbVar3[4];
    lVar4 = (long)(int)((uint)*pbVar3 + (uint)pbVar3[7]) -
            (long)(int)((uint)pbVar3[3] + (uint)pbVar3[4]);
    iVar2 = (uint)pbVar3[1] + (uint)pbVar3[6] + (uint)pbVar3[2] + (uint)pbVar3[5];
    lVar5 = (long)(int)((uint)pbVar3[1] + (uint)pbVar3[6]) -
            (long)(int)((uint)pbVar3[2] + (uint)pbVar3[5]);
    lVar6 = (long)(int)((uint)*pbVar3 - (uint)pbVar3[7]);
    lVar7 = (long)(int)((uint)pbVar3[1] - (uint)pbVar3[6]);
    lVar8 = (long)(int)((uint)pbVar3[2] - (uint)pbVar3[5]);
    lVar9 = (long)(int)((uint)pbVar3[3] - (uint)pbVar3[4]);
    *(int *)elemptr = (iVar1 + iVar2 + -0x400) * 4;
    *(int *)(elemptr + 0x10) = (iVar1 - iVar2) * 4;
    lVar10 = (lVar4 + lVar5) * 0x1151 + 0x400;
    *(int *)(elemptr + 8) = (int)(lVar10 + lVar4 * 0x187e >> 0xb);
    *(int *)(elemptr + 0x18) = (int)(lVar10 + lVar5 * -0x3b21 >> 0xb);
    lVar11 = (lVar6 + lVar8 + lVar7 + lVar9) * 0x25a1 + 0x400;
    lVar4 = (lVar6 + lVar9) * -0x1ccd;
    lVar5 = (lVar7 + lVar8) * -0x5203;
    lVar10 = lVar11 + (lVar6 + lVar8) * -0xc7c;
    lVar11 = lVar11 + (lVar7 + lVar9) * -0x3ec5;
    *(int *)(elemptr + 4) = (int)(lVar6 * 0x300b + lVar4 + lVar10 >> 0xb);
    *(int *)(elemptr + 0xc) = (int)(lVar7 * 0x6254 + lVar5 + lVar11 >> 0xb);
    *(int *)(elemptr + 0x14) = (int)(lVar8 * 0x41b3 + lVar5 + lVar10 >> 0xb);
    *(int *)(elemptr + 0x1c) = (int)(lVar9 * 0x98e + lVar4 + lVar11 >> 0xb);
    elemptr = elemptr + 0x20;
  }
  elemptr = (JSAMPROW)data;
  for (local_7c = 7; -1 < local_7c; local_7c = local_7c + -1) {
    lVar4 = (long)(*(int *)elemptr + *(int *)(elemptr + 0xe0)) +
            (long)(*(int *)(elemptr + 0x60) + *(int *)(elemptr + 0x80)) + 2;
    lVar5 = (long)(*(int *)elemptr + *(int *)(elemptr + 0xe0)) -
            (long)(*(int *)(elemptr + 0x60) + *(int *)(elemptr + 0x80));
    lVar6 = (long)(*(int *)(elemptr + 0x20) + *(int *)(elemptr + 0xc0)) +
            (long)(*(int *)(elemptr + 0x40) + *(int *)(elemptr + 0xa0));
    lVar7 = (long)(*(int *)(elemptr + 0x20) + *(int *)(elemptr + 0xc0)) -
            (long)(*(int *)(elemptr + 0x40) + *(int *)(elemptr + 0xa0));
    lVar8 = (long)(*(int *)elemptr - *(int *)(elemptr + 0xe0));
    lVar9 = (long)(*(int *)(elemptr + 0x20) - *(int *)(elemptr + 0xc0));
    lVar10 = (long)(*(int *)(elemptr + 0x40) - *(int *)(elemptr + 0xa0));
    lVar11 = (long)(*(int *)(elemptr + 0x60) - *(int *)(elemptr + 0x80));
    *(int *)elemptr = (int)(lVar4 + lVar6 >> 2);
    *(int *)(elemptr + 0x80) = (int)(lVar4 - lVar6 >> 2);
    lVar4 = (lVar5 + lVar7) * 0x1151 + 0x4000;
    *(int *)(elemptr + 0x40) = (int)(lVar4 + lVar5 * 0x187e >> 0xf);
    *(int *)(elemptr + 0xc0) = (int)(lVar4 + lVar7 * -0x3b21 >> 0xf);
    lVar7 = (lVar8 + lVar10 + lVar9 + lVar11) * 0x25a1 + 0x4000;
    lVar4 = (lVar8 + lVar11) * -0x1ccd;
    lVar5 = (lVar9 + lVar10) * -0x5203;
    lVar6 = lVar7 + (lVar8 + lVar10) * -0xc7c;
    lVar7 = lVar7 + (lVar9 + lVar11) * -0x3ec5;
    *(int *)(elemptr + 0x20) = (int)(lVar8 * 0x300b + lVar4 + lVar6 >> 0xf);
    *(int *)(elemptr + 0x60) = (int)(lVar9 * 0x6254 + lVar5 + lVar7 >> 0xf);
    *(int *)(elemptr + 0xa0) = (int)(lVar10 * 0x41b3 + lVar5 + lVar6 >> 0xf);
    *(int *)(elemptr + 0xe0) = (int)(lVar11 * 0x98e + lVar4 + lVar7 >> 0xf);
    elemptr = elemptr + 4;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_islow (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp10 + tmp11 - 8 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM) ((tmp10 - tmp11) << PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);
    dataptr[2] = (DCTELEM) RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865),
				       CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065),
				       CONST_BITS-PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];

    /* Add fudge factor here for final descale. */
    tmp10 = tmp0 + tmp3 + (ONE << (PASS1_BITS-1));
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) RIGHT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865), CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065), CONST_BITS+PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}